

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

string * __thiscall
miniros::console::Formatter::getTokenStrings_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,void *logger_handle,Level level,char *str,
          char *file,char *function,int line)

{
  element_type *peVar1;
  pointer psVar2;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (psVar2 = (this->tokens_).
                super__Vector_base<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != (this->tokens_).
                super__Vector_base<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    peVar1 = (psVar2->super___shared_ptr<miniros::console::Token,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*peVar1->_vptr_Token[2])
              (local_1d8,peVar1,logger_handle,(ulong)level,str,file,function,(ulong)(uint)line);
    std::operator<<(local_1a8,local_1d8);
    std::__cxx11::string::~string(local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string Formatter::getTokenStrings(void *logger_handle, Level level,
    const char *str, const char *file,
    const char *function, int line) const
{
  std::stringstream ss;

  for (V_Token::const_iterator it = tokens_.begin(); it != tokens_.end(); ++it)
  {
    ss << (*it)->getString(logger_handle, level, str, file, function, line);
  }

  return ss.str();
}